

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void idx2::IncreaseCapacity<unsigned_long,idx2::chunk_cache>
               (hash_table<unsigned_long,_idx2::chunk_cache> *Ht)

{
  hash_table<unsigned_long,_idx2::chunk_cache> *Ht_00;
  hash_table<unsigned_long,_idx2::chunk_cache> *extraout_RDX;
  hash_table<unsigned_long,_idx2::chunk_cache> *Ht_01;
  chunk_cache *in_R8;
  iterator local_b8;
  iterator local_98;
  undefined1 local_78 [8];
  iterator It;
  hash_table<unsigned_long,_idx2::chunk_cache> NewHt;
  hash_table<unsigned_long,_idx2::chunk_cache> *Ht_local;
  
  hash_table<unsigned_long,_idx2::chunk_cache>::hash_table
            ((hash_table<unsigned_long,_idx2::chunk_cache> *)&It.Idx);
  Init<unsigned_long,idx2::chunk_cache>
            ((hash_table<unsigned_long,_idx2::chunk_cache> *)&It.Idx,Ht->LogCapacity + 1,Ht->Alloc);
  Begin<unsigned_long,idx2::chunk_cache>((iterator *)local_78,(idx2 *)Ht,Ht_00);
  Ht_01 = extraout_RDX;
  while (End<unsigned_long,idx2::chunk_cache>(&local_98,(idx2 *)Ht,Ht_01),
        It.Val != (chunk_cache *)local_98.Ht ||
        It.Ht != (hash_table<unsigned_long,_idx2::chunk_cache> *)local_98.Idx) {
    Insert<unsigned_long,idx2::chunk_cache>
              (&local_b8,(idx2 *)&It.Idx,(hash_table<unsigned_long,_idx2::chunk_cache> *)local_78,
               It.Key,in_R8);
    do {
      It.Ht = (hash_table<unsigned_long,_idx2::chunk_cache> *)((long)&(It.Ht)->Keys + 1);
    } while (*(char *)((long)&(It.Ht)->Keys + ((It.Val)->Bricks).Buffer.Bytes) != '\x02');
    local_78 = (undefined1  [8])(*(long *)It.Val + (long)It.Ht * 8);
    Ht_01 = (hash_table<unsigned_long,_idx2::chunk_cache> *)((long)It.Ht * 0xa0);
    It.Key = (unsigned_long *)((long)&Ht_01->Keys + (long)((It.Val)->Bricks).Buffer.Data);
  }
  Dealloc<unsigned_long,idx2::chunk_cache>(Ht);
  memcpy(Ht,&It.Idx,0x30);
  return;
}

Assistant:

void
IncreaseCapacity(hash_table<k, v>* Ht)
{
  hash_table<k, v> NewHt;
  Init(&NewHt, Ht->LogCapacity + 1, Ht->Alloc);
  for (auto It = Begin(*Ht); It != End(*Ht); ++It)
    Insert(&NewHt, *(It.Key), *(It.Val));
  Dealloc(Ht);
  *Ht = NewHt;
}